

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O3

int tnt_schema_add_spaces(tnt_schema *schema_obj,tnt_reply *r)

{
  byte bVar1;
  mh_assoc_t *h;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte *pbVar6;
  char *__dest;
  mh_assoc_t *pmVar7;
  assoc_val *paVar8;
  byte *extraout_RAX;
  assoc_val ***ret;
  assoc_val ***ret_00;
  long lVar9;
  int64_t iVar10;
  byte *pbVar11;
  tnt_schema_sval *val;
  assoc_val *ptr;
  assoc_val *local_58;
  assoc_val *space_string;
  assoc_val *space_number;
  byte *local_40;
  byte *local_38;
  
  h = schema_obj->space_hash;
  local_38 = (byte *)r->data;
  iVar4 = mp_check((char **)&local_38,r->data_end);
  if (iVar4 != 0) {
    return -1;
  }
  pbVar11 = (byte *)r->data;
  bVar1 = *pbVar11;
  if (mp_type_hint[bVar1] != MP_ARRAY) {
    return -1;
  }
  local_38 = pbVar11 + 1;
  if ((bVar1 & 0x40) == 0) {
    paVar8 = (assoc_val *)(ulong)(bVar1 & 0xf);
  }
  else {
    if ((bVar1 & 1) == 0) goto LAB_0010ff62;
    uVar5 = *(uint *)(pbVar11 + 1);
    paVar8 = (assoc_val *)
             (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    local_38 = pbVar11 + 5;
  }
LAB_0010fb93:
  if ((int)paVar8 == 0) {
    return 0;
  }
  do {
    ptr = (assoc_val *)0x0;
    local_58 = (assoc_val *)0x0;
    space_string = (assoc_val *)0x0;
    local_40 = local_38;
    bVar1 = *local_38;
    val = (tnt_schema_sval *)0x0;
    if (mp_type_hint[bVar1] != MP_ARRAY) {
LAB_0010fed3:
      paVar8 = (assoc_val *)0x1;
      goto LAB_0010fedc;
    }
    if ((bVar1 & 0x40) == 0) {
      pbVar11 = local_38 + 1;
    }
    else {
      pbVar11 = local_38 + (ulong)(bVar1 & 1) * 2 + 3;
    }
    space_number = paVar8;
    local_40 = pbVar11;
    val = (tnt_schema_sval *)tnt_mem_alloc(0x18);
    if (val == (tnt_schema_sval *)0x0) {
      val = (tnt_schema_sval *)0x0;
      goto LAB_0010fed3;
    }
    val->name = (char *)0x0;
    val->name_len = 0;
    val->number = 0;
    val->index = (mh_assoc_t *)0x0;
    bVar1 = *pbVar11;
    uVar5 = (uint)bVar1;
    if (mp_type_hint[bVar1] != MP_UINT) goto LAB_0010fed3;
    switch(bVar1) {
    case 0xcc:
      uVar5 = (uint)pbVar11[1];
      local_40 = pbVar11 + 2;
      break;
    case 0xcd:
      local_40 = pbVar11 + 3;
      uVar5 = (uint)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
      break;
    case 0xce:
      uVar5 = *(uint *)(pbVar11 + 1);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      local_40 = pbVar11 + 5;
      break;
    case 0xcf:
      uVar2 = *(undefined8 *)(pbVar11 + 1);
      uVar5 = (uint)(byte)((ulong)uVar2 >> 0x38) | ((uint)((ulong)uVar2 >> 0x20) & 0xff0000) >> 8 |
              (uint)((ulong)uVar2 >> 0x18) & 0xff0000 | (uint)((ulong)uVar2 >> 8) & 0xff000000;
      local_40 = pbVar11 + 9;
      break;
    default:
      if ((char)bVar1 < '\0') {
        tnt_schema_add_spaces_cold_2();
        local_38 = extraout_RAX;
        goto LAB_0010ff86;
      }
      local_40 = pbVar11 + 1;
    }
    space_number = (assoc_val *)(ulong)((int)space_number - 1);
    val->number = uVar5;
    iVar10 = 1;
    do {
      pbVar6 = local_40 + 1;
      pbVar11 = (byte *)(long)""[*local_40];
      if ((long)pbVar11 < 0) {
        if (*local_40 == 0xd9) {
          pbVar6 = local_40 + (ulong)local_40[1] + 2;
        }
        else {
          if ((byte)""[*local_40] < 0xe1) {
            mp_next_slowpath((char **)&local_40,iVar10);
            break;
          }
          iVar10 = iVar10 - (long)pbVar11;
        }
      }
      else {
        pbVar6 = pbVar6 + (long)pbVar11;
      }
      bVar3 = 1 < iVar10;
      iVar10 = iVar10 + -1;
      local_40 = pbVar6;
    } while (bVar3);
    bVar1 = *local_40;
    if (mp_type_hint[bVar1] != MP_STR) {
LAB_0010fec6:
      ptr = (assoc_val *)0x0;
      goto LAB_0010fed3;
    }
    pbVar6 = local_40 + 1;
    if (bVar1 == 0xdb) {
      uVar5 = *(uint *)(local_40 + 1);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      pbVar6 = local_40 + 5;
    }
    else if (bVar1 == 0xda) {
      pbVar6 = local_40 + 3;
      uVar5 = (uint)(ushort)(*(ushort *)(local_40 + 1) << 8 | *(ushort *)(local_40 + 1) >> 8);
    }
    else if (bVar1 == 0xd9) {
      uVar5 = (uint)local_40[1];
      pbVar6 = local_40 + 2;
    }
    else {
      pbVar11 = (byte *)(ulong)(bVar1 + 0x40);
      if ((byte)(bVar1 + 0x40) < 0xe0) break;
      uVar5 = bVar1 & 0x1f;
    }
    val->name_len = uVar5;
    local_40 = pbVar6 + uVar5;
    __dest = (char *)tnt_mem_alloc((ulong)uVar5);
    val->name = __dest;
    if (__dest == (char *)0x0) goto LAB_0010fec6;
    memcpy(__dest,pbVar6,(ulong)val->name_len);
    pmVar7 = mh_assoc_new();
    val->index = pmVar7;
    if (pmVar7 == (mh_assoc_t *)0x0) goto LAB_0010fec6;
    paVar8 = (assoc_val *)tnt_mem_alloc(0x18);
    ptr = (assoc_val *)0x0;
    local_58 = paVar8;
    if (paVar8 == (assoc_val *)0x0) goto LAB_0010fed3;
    (paVar8->key).id = val->name;
    (paVar8->key).id_len = val->name_len;
    paVar8->data = val;
    space_string = (assoc_val *)tnt_mem_alloc(0x18);
    if (space_string == (assoc_val *)0x0) {
      space_string = (assoc_val *)0x0;
      ptr = paVar8;
      goto LAB_0010fed3;
    }
    (space_string->key).id = (char *)&val->number;
    (space_string->key).id_len = 4;
    space_string->data = val;
    mh_assoc_put(h,&local_58,ret,pbVar11);
    mh_assoc_put(h,&space_string,ret_00,pbVar11);
    iVar10 = 1;
    do {
      pbVar11 = local_38 + 1;
      lVar9 = (long)""[*local_38];
      if (lVar9 < 0) {
        if (*local_38 == 0xd9) {
          pbVar11 = local_38 + (ulong)local_38[1] + 2;
        }
        else {
          if ((byte)""[*local_38] < 0xe1) {
            mp_next_slowpath((char **)&local_38,iVar10);
            break;
          }
          iVar10 = iVar10 - lVar9;
        }
      }
      else {
        pbVar11 = pbVar11 + lVar9;
      }
      bVar3 = 1 < iVar10;
      local_38 = pbVar11;
      iVar10 = iVar10 + -1;
    } while (bVar3);
    paVar8 = space_number;
    if ((int)space_number == 0) {
      return 0;
    }
  } while( true );
  local_40 = pbVar6;
  tnt_schema_add_spaces_cold_1();
LAB_0010ff62:
  local_38 = pbVar11 + 3;
  paVar8 = (assoc_val *)
           (ulong)(ushort)(*(ushort *)(pbVar11 + 1) << 8 | *(ushort *)(pbVar11 + 1) >> 8);
  goto LAB_0010fb93;
LAB_0010ff86:
  mp_next_slowpath((char **)&local_38,(int64_t)paVar8);
  goto LAB_0010ff23;
  while (bVar3 = 1 < (long)paVar8, local_38 = pbVar11,
        paVar8 = (assoc_val *)((long)&paVar8[-1].data + 7), bVar3) {
LAB_0010fedc:
    pbVar11 = local_38 + 1;
    lVar9 = (long)""[*local_38];
    if (lVar9 < 0) {
      if (*local_38 == 0xd9) {
        pbVar11 = local_38 + (ulong)local_38[1] + 2;
      }
      else {
        if ((byte)""[*local_38] < 0xe1) goto LAB_0010ff86;
        paVar8 = (assoc_val *)((long)paVar8 - lVar9);
      }
    }
    else {
      pbVar11 = pbVar11 + lVar9;
    }
  }
LAB_0010ff23:
  tnt_schema_sval_free(val);
  if (ptr != (assoc_val *)0x0) {
    tnt_mem_free(ptr);
  }
  return -1;
}

Assistant:

int tnt_schema_add_spaces(struct tnt_schema *schema_obj, struct tnt_reply *r) {
	struct mh_assoc_t *schema = schema_obj->space_hash;
	const char *tuple = r->data;
	if (mp_check(&tuple, tuple + (r->data_end - r->data)))
		return -1;
	tuple = r->data;
	if (mp_typeof(*tuple) != MP_ARRAY)
		return -1;
	uint32_t space_count = mp_decode_array(&tuple);
	while (space_count-- > 0) {
		if (tnt_schema_add_space(schema, &tuple))
			return -1;
	}
	return 0;
}